

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::CustomLayerParams::_InternalParse
          (CustomLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  internal *this_01;
  size_t size;
  bool bVar4;
  WeightParams *obj;
  MessageLite *msg;
  string *s;
  uint uVar5;
  undefined8 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar7;
  ArenaStringPtr *pAVar8;
  char cVar9;
  uint res;
  pair<const_char_*,_unsigned_int> pVar10;
  StringPiece str;
  byte *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  MapFieldLite<CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *local_38;
  char *field_name;
  
  local_50 = (byte *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
  if (!bVar4) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    local_40 = &this->description_;
    local_38 = &this->parameters_;
    local_48 = &this->classname_;
    do {
      bVar1 = *local_50;
      res = (uint)bVar1;
      pbVar7 = local_50 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar7 * 0x80) - 0x80;
        if ((char)*pbVar7 < '\0') {
          pVar10 = google::protobuf::internal::ReadTagFallback((char *)local_50,res);
          pbVar7 = (byte *)pVar10.first;
          res = pVar10.second;
        }
        else {
          pbVar7 = local_50 + 2;
        }
      }
      uVar5 = res >> 3;
      field_name = (char *)(ulong)uVar5;
      cVar9 = (char)res;
      local_50 = pbVar7;
      if (uVar5 < 0x1e) {
        if (uVar5 == 10) {
          if (cVar9 != 'R') goto LAB_0028134f;
          puVar6 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
          pAVar8 = local_48;
          if ((this_00->ptr_ & 1U) != 0) {
            puVar6 = (undefined8 *)*puVar6;
          }
LAB_002812b7:
          s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar8,puVar6);
          local_50 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (s,(char *)local_50,ctx);
          this_01 = (internal *)(s->_M_dataplus)._M_p;
          size = s->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (size,"string length exceeds max size");
          }
          str.length_ = 0;
          str.ptr_ = (char *)size;
          bVar4 = google::protobuf::internal::VerifyUTF8(this_01,str,field_name);
          if (!bVar4) {
            return (char *)0x0;
          }
          goto joined_r0x00281305;
        }
        if ((uVar5 != 0x14) || (cVar9 != -0x5e)) goto LAB_0028134f;
        local_50 = pbVar7 + -2;
        do {
          local_50 = local_50 + 2;
          pRVar3 = (this->weights_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_00281217:
            obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                            ((this->weights_).super_RepeatedPtrFieldBase.arena_);
            msg = (MessageLite *)
                  google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(this->weights_).super_RepeatedPtrFieldBase,obj);
          }
          else {
            iVar2 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) goto LAB_00281217;
            (this->weights_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (MessageLite *)pRVar3->elements[iVar2];
          }
          local_50 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,msg,(char *)local_50);
          if (local_50 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(short *)local_50 == 0x1a2));
      }
      else {
        if (uVar5 == 0x1e) {
          if (cVar9 == -0xe) {
            local_50 = pbVar7 + -2;
            do {
              local_50 = local_50 + 2;
              local_50 = (byte *)google::protobuf::internal::ParseContext::
                                 ParseMessage<google::protobuf::internal::MapFieldLite<CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_true>
                                           (ctx,local_38,(char *)local_50);
              if (local_50 == (byte *)0x0) {
                return (char *)0x0;
              }
            } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                    (*(short *)local_50 == 0x1f2));
            goto LAB_0028138c;
          }
        }
        else if ((uVar5 == 0x28) && (cVar9 == 'B')) {
          puVar6 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
          pAVar8 = local_40;
          if ((this_00->ptr_ & 1U) != 0) {
            puVar6 = (undefined8 *)*puVar6;
          }
          goto LAB_002812b7;
        }
LAB_0028134f:
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar7 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar7;
        }
        if ((this_00->ptr_ & 1U) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_50 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_50,ctx);
joined_r0x00281305:
        if (local_50 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
LAB_0028138c:
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_50;
}

Assistant:

const char* CustomLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string className = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_classname();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.WeightParams weights = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_weights(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<162>(ptr));
        } else
          goto handle_unusual;
        continue;
      // map<string, .CoreML.Specification.CustomLayerParams.CustomLayerParamValue> parameters = 30;
      case 30:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 242)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(&parameters_, ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<242>(ptr));
        } else
          goto handle_unusual;
        continue;
      // string description = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          auto str = _internal_mutable_description();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}